

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O3

void __thiscall
t_py_generator::generate_py_struct_reader(t_py_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  t_field *ptVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  long lVar7;
  _Alloc_hider _Var8;
  char *pcVar9;
  pointer pptVar10;
  ostringstream result;
  string local_230;
  char *local_210;
  long local_208;
  char local_200 [16];
  t_field *local_1f0;
  string local_1e8;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  bVar4 = is_immutable(&tstruct->super_t_type);
  if (bVar4) {
    t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"@classmethod",0xc);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_230,&this->super_t_generator);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"def read(cls, iprot):",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p);
    }
  }
  else {
    poVar6 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"def read(self, iprot):",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  bVar4 = is_immutable(&tstruct->super_t_type);
  pcVar9 = "self";
  if (bVar4) {
    pcVar9 = "cls";
  }
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,
             "if iprot._fast_decode is not None and isinstance(iprot.trans, TTransport.CReadableTransport) and "
             ,0x61);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,4 - (ulong)bVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,".thrift_spec is not None:",0x19);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  bVar4 = is_immutable(&tstruct->super_t_type);
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  if (bVar4) {
    pcVar9 = "return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])";
    lVar7 = 0x3e;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])",0x43);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar6 = t_generator::indent(&this->super_t_generator,out);
    pcVar9 = "return";
    lVar7 = 6;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar9,lVar7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.readStructBegin()",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  bVar4 = is_immutable(&tstruct->super_t_type);
  if ((bVar4) &&
     (pptVar10 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
     pptVar10 !=
     (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
     super__Vector_impl_data._M_finish)) {
    do {
      ptVar3 = *pptVar10;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(ptVar3->name_)._M_dataplus._M_p,
                          (ptVar3->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      if (ptVar3->value_ == (t_const_value *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"None",4);
      }
      else {
        render_field_default_value_abi_cxx11_(&local_230,this,ptVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
      }
      poVar6 = t_generator::indent(&this->super_t_generator,out);
      std::__cxx11::stringbuf::str();
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      pptVar10 = pptVar10 + 1;
    } while (pptVar10 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"while True:",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"(fname, ftype, fid) = iprot.readFieldBegin()",0x2c);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if ftype == TType.STOP:",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"break",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  pptVar10 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar10 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar2 = &local_1a8[0].field_2;
    bVar4 = true;
    do {
      if (bVar4) {
        t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if ",3);
      }
      else {
        t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"elif ",5);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"fid == ",7);
      poVar6 = (ostream *)std::ostream::operator<<(out,(*pptVar10)->key_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      poVar6 = t_generator::indent(&this->super_t_generator,out);
      pcVar9 = "if ftype == ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"if ftype == ",0xc);
      type_to_enum_abi_cxx11_(local_1a8,(t_py_generator *)pcVar9,(*pptVar10)->type_);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + 1;
      bVar4 = is_immutable(&tstruct->super_t_type);
      ptVar3 = *pptVar10;
      if (bVar4) {
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"");
        generate_deserialize_field(this,out,ptVar3,&local_1e8);
        _Var8._M_p = local_1e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
LAB_003130a3:
          operator_delete(_Var8._M_p);
        }
      }
      else {
        local_1f0 = ptVar3;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"self.","");
        generate_deserialize_field(this,out,local_1f0,&local_1c8);
        _Var8._M_p = local_1c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) goto LAB_003130a3;
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"else:",5);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      t_generator::indent_abi_cxx11_(&local_230,&this->super_t_generator);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
      (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_210);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_210,local_208);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.skip(ftype)",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if (local_210 != local_200) {
        operator_delete(local_210);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != paVar2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_generator).indent_;
      *piVar1 = *piVar1 + -1;
      pptVar10 = pptVar10 + 1;
      bVar4 = false;
    } while (pptVar10 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(local_1a8,&this->super_t_generator);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1a8[0]._M_dataplus._M_p,local_1a8[0]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"else:",5);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_230,&this->super_t_generator);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
  (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_210);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_210,local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.skip(ftype)",0x11);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_210 != local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p);
  }
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.readFieldEnd()",0x14);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar6 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"iprot.readStructEnd()",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  bVar4 = is_immutable(&tstruct->super_t_type);
  if (bVar4) {
    poVar6 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"return cls(",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    iVar5 = (this->super_t_generator).indent_;
    (this->super_t_generator).indent_ = iVar5 + 1;
    pptVar10 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (pptVar10 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        poVar6 = t_generator::indent(&this->super_t_generator,out);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,((*pptVar10)->name_)._M_dataplus._M_p,
                            ((*pptVar10)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"=",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,((*pptVar10)->name_)._M_dataplus._M_p,
                            ((*pptVar10)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        pptVar10 = pptVar10 + 1;
      } while (pptVar10 !=
               (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_finish);
      iVar5 = (this->super_t_generator).indent_ + -1;
    }
    (this->super_t_generator).indent_ = iVar5;
    poVar6 = t_generator::indent(&this->super_t_generator,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,")",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_py_generator::generate_py_struct_reader(ostream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  if (is_immutable(tstruct)) {
    out << indent() << "@classmethod" << endl << indent() << "def read(cls, iprot):" << endl;
  } else {
    indent(out) << "def read(self, iprot):" << endl;
  }
  indent_up();

  const char* id = is_immutable(tstruct) ? "cls" : "self";

  indent(out) << "if iprot._fast_decode is not None "
                 "and isinstance(iprot.trans, TTransport.CReadableTransport) "
                 "and "
              << id << ".thrift_spec is not None:" << endl;
  indent_up();

  if (is_immutable(tstruct)) {
    indent(out) << "return iprot._fast_decode(None, iprot, [cls, cls.thrift_spec])" << endl;
  } else {
    indent(out) << "iprot._fast_decode(self, iprot, [self.__class__, self.thrift_spec])" << endl;
    indent(out) << "return" << endl;
  }
  indent_down();

  indent(out) << "iprot.readStructBegin()" << endl;
  
  if (is_immutable(tstruct)) {
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      t_field* tfield = *f_iter;
      std::ostringstream result;
      result << tfield->get_name() << " = ";
      if (tfield->get_value() != nullptr) {
        result << render_field_default_value(tfield);
      } else {
        result << "None";
      }
      indent(out) << result.str() << endl;
     }
  }

  // Loop over reading in fields
  indent(out) << "while True:" << endl;
  indent_up();

  // Read beginning field marker
  indent(out) << "(fname, ftype, fid) = iprot.readFieldBegin()" << endl;

  // Check for field STOP marker and break
  indent(out) << "if ftype == TType.STOP:" << endl;
  indent_up();
  indent(out) << "break" << endl;
  indent_down();

  // Switch statement on the field we are reading
  bool first = true;

  // Generate deserialization code for known cases
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << indent() << "if ";
    } else {
      out << indent() << "elif ";
    }
    out << "fid == " << (*f_iter)->get_key() << ":" << endl;
    indent_up();
    indent(out) << "if ftype == " << type_to_enum((*f_iter)->get_type()) << ":" << endl;
    indent_up();
    if (is_immutable(tstruct)) {
      generate_deserialize_field(out, *f_iter);
    } else {
      generate_deserialize_field(out, *f_iter, "self.");
    }
    indent_down();
    out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;
    indent_down();
  }

  // In the default case we skip the field
  out << indent() << "else:" << endl << indent() << indent_str() << "iprot.skip(ftype)" << endl;

  // Read field end marker
  indent(out) << "iprot.readFieldEnd()" << endl;

  indent_down();

  indent(out) << "iprot.readStructEnd()" << endl;

  if (is_immutable(tstruct)) {
    indent(out) << "return cls(" << endl;
    indent_up();
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
      indent(out) << (*f_iter)->get_name() << "=" << (*f_iter)->get_name() << "," << endl;
    }
    indent_down();
    indent(out) << ")" << endl;
  }

  indent_down();
  out << endl;
}